

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textmidi.cpp
# Opt level: O2

void checkOptions(Options *opts)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"a|abs|absolute=b",&local_39);
  smf::Options::define(opts,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"d|delta=b",&local_39);
  smf::Options::define(opts,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"author=b",&local_39);
  smf::Options::define(opts,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"version=b",&local_39);
  smf::Options::define(opts,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"example=b",&local_39);
  smf::Options::define(opts,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"help=b",&local_39);
  smf::Options::define(opts,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  smf::Options::process(opts,1,0);
  std::__cxx11::string::string((string *)&local_38,"author",&local_39);
  bVar1 = smf::Options::getBoolean(opts,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Written by Craig Stuart Sapp, ");
    poVar3 = std::operator<<(poVar3,"craig@ccrma.stanford.edu, Nov 1999");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else {
    std::__cxx11::string::string((string *)&local_38,"version",&local_39);
    bVar1 = smf::Options::getBoolean(opts,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    if (bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cout,"textmidi version 1.0");
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<((ostream *)&std::cout,"compiled: ");
      poVar3 = std::operator<<(poVar3,"Apr 26 2025");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    std::__cxx11::string::string((string *)&local_38,"help",&local_39);
    bVar1 = smf::Options::getBoolean(opts,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    if (bVar1) {
      smf::Options::getCommand_abi_cxx11_(&local_38,opts);
      usage(local_38._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_38);
    }
    else {
      std::__cxx11::string::string((string *)&local_38,"example",&local_39);
      bVar1 = smf::Options::getBoolean(opts,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      if (!bVar1) {
        iVar2 = smf::Options::getArgCount(opts);
        if (iVar2 != 0) {
          std::__cxx11::string::string((string *)&local_38,"absolute",&local_39);
          bVar1 = smf::Options::getBoolean(opts,&local_38);
          std::__cxx11::string::~string((string *)&local_38);
          if (bVar1) {
            timestyle = 0x61;
          }
          return;
        }
        poVar3 = std::operator<<((ostream *)&std::cout,"Error: need one input MIDI file.");
        std::endl<char,std::char_traits<char>>(poVar3);
        smf::Options::getCommand_abi_cxx11_(&local_38,opts);
        usage(local_38._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_38);
        exit(1);
      }
      example();
    }
  }
  exit(0);
}

Assistant:

void checkOptions(Options& opts) {
	opts.define("a|abs|absolute=b");
	opts.define("d|delta=b");
	opts.define("author=b");
	opts.define("version=b");
	opts.define("example=b");
	opts.define("help=b");
	opts.process();

	if (opts.getBoolean("author")) {
		cout << "Written by Craig Stuart Sapp, "
		     << "craig@ccrma.stanford.edu, Nov 1999" << endl;
		exit(0);
	}
	if (opts.getBoolean("version")) {
		cout << "textmidi version 1.0" << endl;
		cout << "compiled: " << __DATE__ << endl;
	}
	if (opts.getBoolean("help")) {
		usage(opts.getCommand().c_str());
		exit(0);
	}
	if (opts.getBoolean("example")) {
		example();
		exit(0);
	}

	// can only have one output filename
	if (opts.getArgCount() == 0) {
		cout << "Error: need one input MIDI file." << endl;
		usage(opts.getCommand().c_str());
		exit(1);
	}

	if (opts.getBoolean("absolute")) {
		timestyle = STYLE_TIME_ABSOLUTE;
	}

}